

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

void handleNewWalletRequest(char *initiatorPubKey,json *package)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  _Alloc_hider _Var6;
  _Alloc_hider __s;
  _Alloc_hider _Var7;
  _Alloc_hider __s_00;
  bool bVar8;
  int iVar9;
  reference pvVar10;
  size_type sVar11;
  ostream *poVar12;
  size_t sVar13;
  ulong uVar14;
  reference wallet_definition_template;
  size_type idx;
  char *pcVar15;
  char *local_70;
  string_t local_50;
  
  pvVar10 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        *)package,"body");
  pvVar10 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        *)pvVar10,"wallet");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::dump(&local_50,pvVar10,-1,' ',false,strict);
  _Var6._M_p = local_50._M_dataplus._M_p;
  std::__cxx11::string::~string((string *)&local_50);
  if (_Var6._M_p == (char *)0x0) {
    pcVar15 = "Wallet must be a char";
  }
  else {
    bVar8 = std::type_info::operator==
                      ((type_info *)
                       &nlohmann::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        ::typeinfo,(type_info *)&bool::typeinfo);
    if (bVar8) {
      pvVar10 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                            *)package,"body");
      pvVar10 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                            *)pvVar10,"is_single_address");
      bVar8 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::get<bool,_bool,_0>(pvVar10);
      if (bVar8) {
        bVar8 = std::type_info::operator==
                          ((type_info *)
                           &nlohmann::
                            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                            ::typeinfo,
                           (type_info *)
                           &nlohmann::
                            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                            ::typeinfo);
        if (bVar8) {
          pvVar10 = nlohmann::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                *)package,"body");
          pvVar10 = nlohmann::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                *)pvVar10,"other_cosigners");
          sVar11 = nlohmann::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   ::size(pvVar10);
          pvVar10 = nlohmann::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                *)package,"body");
          pvVar10 = nlohmann::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                *)pvVar10,"other_cosigners");
          bVar8 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  ::empty(pvVar10);
          if (bVar8) {
            pcVar15 = "other_cosigners cannot be empty";
          }
          else {
            pvVar10 = nlohmann::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                      ::operator[]<char_const>
                                ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                  *)package,"device_hub");
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::dump(&local_50,pvVar10,-1,' ',false,strict);
            __s._M_p = local_50._M_dataplus._M_p;
            std::__cxx11::string::~string((string *)&local_50);
            if ((__s._M_p != (char *)0x0) && (sVar13 = strlen(__s._M_p), sVar13 < 0x1e)) {
              newWallet.isCreating = true;
              strcpy(newWallet.initiatorHub,__s._M_p);
              newWallet.initiatorPubKey._0_8_ = *(undefined8 *)initiatorPubKey;
              newWallet.initiatorPubKey._8_8_ = *(undefined8 *)(initiatorPubKey + 8);
              newWallet.initiatorPubKey._16_8_ = *(undefined8 *)(initiatorPubKey + 0x10);
              newWallet.initiatorPubKey._37_8_ = *(undefined8 *)(initiatorPubKey + 0x25);
              newWallet.initiatorPubKey._24_5_ = SUB85(*(undefined8 *)(initiatorPubKey + 0x18),0);
              newWallet.initiatorPubKey._29_3_ = SUB83(*(undefined8 *)(initiatorPubKey + 0x1d),0);
              newWallet.initiatorPubKey._32_5_ =
                   SUB85((ulong)*(undefined8 *)(initiatorPubKey + 0x1d) >> 0x18,0);
              newWallet.id._0_8_ = *(undefined8 *)_Var6._M_p;
              newWallet.id._8_8_ = *(undefined8 *)(_Var6._M_p + 8);
              newWallet.id._16_8_ = *(undefined8 *)(_Var6._M_p + 0x10);
              newWallet.id._37_8_ = *(undefined8 *)(_Var6._M_p + 0x25);
              newWallet.id._24_5_ = SUB85(*(undefined8 *)(_Var6._M_p + 0x18),0);
              newWallet.id._29_3_ = SUB83(*(undefined8 *)(_Var6._M_p + 0x1d),0);
              newWallet.id._32_5_ = SUB85((ulong)*(undefined8 *)(_Var6._M_p + 0x1d) >> 0x18,0);
              idx = 0;
              uVar14 = sVar11 & 0xffffffff;
              if ((int)sVar11 < 1) {
                uVar14 = idx;
              }
              local_70 = newWallet.xPubKeyQueue[0].recipientHub;
              for (; uVar14 != idx; idx = idx + 1) {
                pvVar10 = nlohmann::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                          ::operator[]<char_const>
                                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                      *)package,"body");
                pvVar10 = nlohmann::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                          ::operator[]<char_const>
                                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                      *)pvVar10,"other_cosigners");
                pvVar10 = nlohmann::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          ::operator[](pvVar10,idx);
                pvVar10 = nlohmann::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                          ::operator[]<char_const>
                                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                      *)pvVar10,"device_address");
                nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                ::dump(&local_50,pvVar10,-1,' ',false,strict);
                _Var6._M_p = local_50._M_dataplus._M_p;
                std::__cxx11::string::~string((string *)&local_50);
                pvVar10 = nlohmann::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                          ::operator[]<char_const>
                                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                      *)package,"body");
                pvVar10 = nlohmann::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                          ::operator[]<char_const>
                                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                      *)pvVar10,"other_cosigners");
                pvVar10 = nlohmann::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          ::operator[](pvVar10,idx);
                pvVar10 = nlohmann::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                          ::operator[]<char_const>
                                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                      *)pvVar10,"pubkey");
                nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                ::dump(&local_50,pvVar10,-1,' ',false,strict);
                _Var7._M_p = local_50._M_dataplus._M_p;
                std::__cxx11::string::~string((string *)&local_50);
                pvVar10 = nlohmann::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                          ::operator[]<char_const>
                                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                      *)package,"body");
                pvVar10 = nlohmann::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                          ::operator[]<char_const>
                                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                      *)pvVar10,"other_cosigners");
                pvVar10 = nlohmann::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          ::operator[](pvVar10,idx);
                pvVar10 = nlohmann::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                          ::operator[]<char_const>
                                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                      *)pvVar10,"device_hub");
                nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                ::dump(&local_50,pvVar10,-1,' ',false,strict);
                __s_00._M_p = local_50._M_dataplus._M_p;
                std::__cxx11::string::~string((string *)&local_50);
                if (((__s_00._M_p != (char *)0x0 &&
                      (_Var6._M_p != (char *)0x0 && _Var7._M_p != (char *)0x0)) &&
                    (sVar13 = strlen(__s_00._M_p), sVar13 < 0x1e)) &&
                   (iVar9 = strcmp(_Var6._M_p,byteduino_device.deviceAddress), iVar9 != 0)) {
                  ((queueXpubkeyTobeSent *)(local_70 + -0x2e))->isFree = false;
                  uVar1 = *(undefined8 *)(_Var7._M_p + 8);
                  uVar2 = *(undefined8 *)(_Var7._M_p + 0x10);
                  uVar3 = *(undefined8 *)(_Var7._M_p + 0x18);
                  uVar4 = *(undefined8 *)(_Var7._M_p + 0x1d);
                  uVar5 = *(undefined8 *)(_Var7._M_p + 0x25);
                  *(undefined8 *)(local_70 + -0x2d) = *(undefined8 *)_Var7._M_p;
                  *(undefined8 *)(local_70 + -0x25) = uVar1;
                  *(undefined8 *)(local_70 + -0x1d) = uVar2;
                  *(undefined8 *)(local_70 + -0x15) = uVar3;
                  *(undefined8 *)(local_70 + -0x10) = uVar4;
                  *(undefined8 *)(local_70 + -8) = uVar5;
                  strcpy(local_70,__s_00._M_p);
                }
                local_70 = local_70 + 0x4c;
              }
            }
            iVar9 = (int)sVar11 + 1;
            newWallet.xPubKeyQueue[iVar9].isFree = false;
            uVar1 = *(undefined8 *)(initiatorPubKey + 8);
            uVar2 = *(undefined8 *)(initiatorPubKey + 0x10);
            uVar3 = *(undefined8 *)(initiatorPubKey + 0x18);
            uVar4 = *(undefined8 *)(initiatorPubKey + 0x1d);
            uVar5 = *(undefined8 *)(initiatorPubKey + 0x25);
            *(undefined8 *)newWallet.xPubKeyQueue[iVar9].recipientPubKey =
                 *(undefined8 *)initiatorPubKey;
            *(undefined8 *)(newWallet.xPubKeyQueue[iVar9].recipientPubKey + 8) = uVar1;
            *(undefined8 *)(newWallet.xPubKeyQueue[iVar9].recipientPubKey + 0x10) = uVar2;
            *(undefined8 *)(newWallet.xPubKeyQueue[iVar9].recipientPubKey + 0x18) = uVar3;
            *(undefined8 *)(newWallet.xPubKeyQueue[iVar9].recipientPubKey + 0x1d) = uVar4;
            *(undefined8 *)(newWallet.xPubKeyQueue[iVar9].recipientPubKey + 0x25) = uVar5;
            strcpy(newWallet.xPubKeyQueue[iVar9].recipientHub,__s._M_p);
            pvVar10 = nlohmann::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                      ::operator[]<char_const>
                                ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                  *)package,"body");
            pvVar10 = nlohmann::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                      ::operator[]<char_const>
                                ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                  *)pvVar10,"wallet_name");
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::dump(&local_50,pvVar10,-1,' ',false,strict);
            std::__cxx11::string::~string((string *)&local_50);
            if ((local_50._M_dataplus._M_p != (char *)0x0) &&
               (bVar8 = std::type_info::operator==
                                  ((type_info *)
                                   &nlohmann::
                                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                    ::typeinfo,
                                   (type_info *)
                                   &nlohmann::
                                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                    ::typeinfo), bVar8)) {
              pvVar10 = nlohmann::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        ::operator[]<char_const>
                                  ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                    *)package,"body");
              wallet_definition_template =
                   nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                               *)pvVar10,"wallet_definition_template");
              saveWalletDefinitionInFlash
                        ((char *)pvVar10,local_50._M_dataplus._M_p,wallet_definition_template);
              return;
            }
            pcVar15 = "wallet_definition_template and wallet_name must be char";
          }
        }
        else {
          pcVar15 = "other_cosigners must be an array";
        }
        goto LAB_001c22b3;
      }
    }
    pcVar15 = "Wallet must single address wallet";
  }
LAB_001c22b3:
  poVar12 = std::operator<<((ostream *)&std::clog,pcVar15);
  std::endl<char,std::char_traits<char>>(poVar12);
  return;
}

Assistant:

void handleNewWalletRequest(char initiatorPubKey [45], nlohmann::json& package){
	const char* wallet = package["body"]["wallet"].dump().c_str();
	if (wallet != nullptr){
		if (typeid(package["body"]["is_single_address"]) == typeid(bool) && package["body"]["is_single_address"]){
			if(typeid(package["body"]["other_cosigners"]) == typeid(nlohmann::json)){
				int otherCosignersSize = package["body"]["other_cosigners"].size();
				if (!package["body"]["other_cosigners"].empty()){
					const char * initiator_device_hub = package["device_hub"].dump().c_str();
					if (initiator_device_hub != nullptr && strlen(initiator_device_hub) < MAX_HUB_STRING_SIZE){
						newWallet.isCreating = true;
						strcpy(newWallet.initiatorHub, initiator_device_hub);
						memcpy(newWallet.initiatorPubKey,initiatorPubKey,45);
						memcpy(newWallet.id,wallet,45);


						for (int i = 0; i < otherCosignersSize;i++){
							const  char* device_address = package["body"]["other_cosigners"][i]["device_address"].dump().c_str();
							const  char* pubkey = package["body"]["other_cosigners"][i]["pubkey"].dump().c_str();
							const  char* device_hub = package["body"]["other_cosigners"][i]["device_hub"].dump().c_str();

							if (pubkey != nullptr && device_address != nullptr && device_hub != nullptr){
								if (strlen(device_hub) < MAX_HUB_STRING_SIZE){
									if (strcmp(device_address, byteduino_device.deviceAddress) != 0){
										newWallet.xPubKeyQueue[i].isFree = false;
										memcpy(newWallet.xPubKeyQueue[i].recipientPubKey, pubkey,45);
										strcpy(newWallet.xPubKeyQueue[i].recipientHub, device_hub);
									}
								}

							}
						}
					}
					newWallet.xPubKeyQueue[otherCosignersSize+1].isFree = false;
					memcpy(newWallet.xPubKeyQueue[otherCosignersSize+1].recipientPubKey, initiatorPubKey, 45);
					strcpy(newWallet.xPubKeyQueue[otherCosignersSize+1].recipientHub, initiator_device_hub);

					const char* wallet_name = package["body"]["wallet_name"].dump().c_str();
					if (wallet_name != nullptr &&
                            typeid(package["body"]["wallet_definition_template"]) == typeid(nlohmann::json)){
						saveWalletDefinitionInFlash(wallet, wallet_name, package["body"]["wallet_definition_template"]);
					} else {
#ifdef DEBUG_PRINT
						std::clog << "wallet_definition_template and wallet_name must be char" << std::endl;
#endif
					}
				} else {
#ifdef DEBUG_PRINT
					std::clog << "other_cosigners cannot be empty" << std::endl;
#endif
				}
			} else {
#ifdef DEBUG_PRINT
				std::clog << "other_cosigners must be an array" << std::endl;
#endif
			}
		} else {
			std::clog << "Wallet must single address wallet" << std::endl;
		}
	} else {
#ifdef DEBUG_PRINT
		std::clog << "Wallet must be a char" << std::endl;
#endif
	}

}